

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

void lws_wsi_mux_close_children(lws *wsi,int reason)

{
  undefined1 *puVar1;
  lws *plVar2;
  lws *plVar3;
  
  plVar3 = (wsi->mux).child_list;
  if (plVar3 != (lws *)0x0) {
    while (plVar3 != (lws *)0x0) {
      _lws_log(8,"   closing child %p\n",plVar3);
      plVar2 = (wsi->mux).child_list;
      plVar3 = (plVar2->mux).sibling_list;
      if (plVar3 == plVar2) {
        __assert_fail("wsi2 != *w",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/wsi.c"
                      ,0x461,"void lws_wsi_mux_close_children(struct lws *, int)");
      }
      (plVar2->mux).sibling_list = (lws *)0x0;
      puVar1 = &((wsi->mux).child_list)->field_0x2dc;
      *(ulong *)puVar1 = *(ulong *)puVar1 | 0x1000;
      __lws_close_free_wsi((wsi->mux).child_list,reason,"mux child recurse");
      (wsi->mux).child_list = plVar3;
    }
  }
  return;
}

Assistant:

void
lws_wsi_mux_close_children(struct lws *wsi, int reason)
{
	struct lws *wsi2;

	if (!wsi->mux.child_list)
		return;

	lws_start_foreach_llp(struct lws **, w, wsi->mux.child_list) {
		lwsl_info("   closing child %p\n", *w);
		/* disconnect from siblings */
		wsi2 = (*w)->mux.sibling_list;
		assert (wsi2 != *w);
		(*w)->mux.sibling_list = NULL;
		(*w)->socket_is_permanently_unusable = 1;
		__lws_close_free_wsi(*w, reason, "mux child recurse");
		*w = wsi2;
		continue;
	} lws_end_foreach_llp(w, mux.sibling_list);
}